

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

_Bool string_lower(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  uint uVar1;
  gravity_object_t *pgVar2;
  char *__dest;
  __int32_t **pp_Var3;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar4;
  gravity_fiber_t *pgVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  _Bool _Var9;
  gravity_value_t value;
  gravity_value_t value_00;
  char _buffer [4096];
  char local_1038 [4104];
  
  pgVar2 = (args->field_1).p;
  __dest = (char *)gravity_calloc(vm,1,(ulong)(*(int *)((long)&pgVar2->identifier + 4) + 1));
  if (__dest == (char *)0x0) {
LAB_00129f0e:
    _Var9 = false;
    value_00.field_1.n = 0;
    value_00.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_00,rindex);
  }
  else {
    strcpy(__dest,(char *)pgVar2->objclass);
    if (nargs != 0) {
      if (nargs == 1) {
        uVar6 = 0xffffffffffffffff;
        pp_Var3 = __ctype_tolower_loc();
        do {
          __dest[uVar6 + 1] = (char)(*pp_Var3)[__dest[uVar6 + 1]];
          uVar6 = uVar6 + 1;
        } while (uVar6 < *(uint *)((long)&pgVar2->identifier + 4));
      }
      else {
        lVar8 = 0x10;
        do {
          if (*(gravity_class_t **)((long)&args->isa + lVar8) != gravity_class_int) {
            free(__dest);
            builtin_strncpy(local_1038 + 0x30,"arguments.",0xb);
            builtin_strncpy(local_1038 + 0x20,"nts, or integer ",0x10);
            builtin_strncpy(local_1038 + 0x10,"either no argume",0x10);
            builtin_strncpy(local_1038,"lower() expects ",0x10);
            pgVar5 = gravity_vm_fiber(vm);
            gravity_fiber_seterror(pgVar5,local_1038);
            goto LAB_00129f0e;
          }
          uVar7 = *(uint *)((long)&args->field_1 + lVar8);
          uVar1 = *(uint *)((long)&pgVar2->identifier + 4);
          if ((((int)uVar7 < 0) && (uVar7 = uVar7 + uVar1, (int)uVar7 < 0)) || (uVar1 <= uVar7)) {
            free(__dest);
            snprintf(local_1038,0x1000,"Out of bounds error: index %d beyond bounds 0...%d",
                     (ulong)uVar7,(ulong)(*(int *)((long)&pgVar2->identifier + 4) - 1));
            pgVar5 = gravity_vm_fiber(vm);
            gravity_fiber_seterror(pgVar5,local_1038);
            goto LAB_00129f0e;
          }
          pp_Var3 = __ctype_tolower_loc();
          __dest[uVar7] = (char)(*pp_Var3)[__dest[uVar7]];
          lVar8 = lVar8 + 0x10;
        } while ((ulong)nargs * 0x10 != lVar8);
      }
    }
    aVar4.p = (gravity_object_t *)
              gravity_string_new(vm,__dest,*(uint32_t *)((long)&pgVar2->identifier + 4),0);
    value.field_1.p = (gravity_object_t *)aVar4.n;
    value.isa = (aVar4.p)->isa;
    gravity_vm_setslot(vm,value,rindex);
    _Var9 = true;
  }
  return _Var9;
}

Assistant:

static bool string_lower (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    gravity_string_t *main_str = VALUE_AS_STRING(GET_VALUE(0));

    char *ret = mem_alloc(vm, main_str->len + 1);
    CHECK_MEM_ALLOC(ret);
    strcpy(ret, main_str->s);

    // if no arguments passed, change the whole string to lowercase
    if (nargs == 1) {
        for (int i = 0; i <= main_str->len; ++i) {
         ret[i] = tolower(ret[i]);
        }
    }
    // otherwise, evaluate all the arguments
    else {
        for (int i = 1; i < nargs; ++i) {
            gravity_value_t value = GET_VALUE(i);
            if (VALUE_ISA_INT(value)) {
                int32_t index = (int32_t)VALUE_AS_INT(value);

                if (index < 0) index = main_str->len + index;
                if ((index < 0) || ((uint32_t)index >= main_str->len))  {
                    mem_free(ret);
                    RETURN_ERROR("Out of bounds error: index %d beyond bounds 0...%d", index, main_str->len - 1);
                }

                ret[index] = tolower(ret[index]);
            }
            else {
                mem_free(ret);
                RETURN_ERROR("lower() expects either no arguments, or integer arguments.");
            }
        }
    }

    gravity_string_t *s = gravity_string_new(vm, ret, main_str->len, 0);
    RETURN_VALUE(VALUE_FROM_OBJECT(s), rindex);
}